

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  llama_token *plVar1;
  float *pfVar2;
  llama_pos *plVar3;
  int32_t *piVar4;
  llama_seq_id **pplVar5;
  llama_token lVar6;
  uint uVar7;
  pointer plVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  size_type sVar12;
  common_log *pcVar13;
  reference piVar14;
  int *piVar15;
  reference pvVar16;
  reference pvVar17;
  undefined8 uVar18;
  reference pvVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  int64_t t_dec_end;
  int s_1;
  int i_7;
  int idx_1;
  int head;
  int j_6;
  bool is_match;
  int idx_2;
  int k;
  bool is_unique;
  int j_5;
  int ft;
  int f;
  vector<int,_std::allocator<int>_> ngram;
  int i_6;
  int i_5;
  int j_4;
  int i_4;
  int g_3;
  string token_str_1;
  int g_2;
  int i_batch;
  int v;
  int seq_id_best;
  int i_3;
  int j_3;
  int j_2;
  int i_2;
  llama_token t;
  int idx;
  int g_1;
  int j_1;
  int g;
  int g_cur;
  string token_str;
  int64_t t_dec_start;
  llama_kv_cache_view kvc_view;
  ngram_container ngrams_observed;
  int i_1;
  vector<int,_std::allocator<int>_> seq_id_all;
  vector<int,_std::allocator<int>_> seq_id_look;
  int i;
  int j;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  tokens_j;
  vector<int,_std::allocator<int>_> tokens_j_prev;
  vector<ngram_data,_std::allocator<ngram_data>_> ngrams_cur;
  common_sampler *smpl;
  llama_batch batch;
  bool has_eos;
  llama_token id;
  int n_past;
  int n_accept;
  int n_predict;
  int64_t t_enc_end;
  int s;
  int64_t t_enc_start;
  int n_input;
  int id_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int max_tokens_list_size;
  int max_context_size;
  vector<int,_std::allocator<int>_> all;
  vector<int,_std::allocator<int>_> inp;
  llama_vocab *vocab;
  llama_context *ctx;
  llama_model *model;
  common_init_result llama_init;
  bool dump_kv_cache;
  int G;
  int N;
  int W;
  common_params params;
  undefined4 in_stack_ffffffffffffe598;
  undefined4 uVar23;
  undefined1 accept_grammar;
  int32_t iVar24;
  undefined4 in_stack_ffffffffffffe59c;
  llama_token lVar25;
  undefined4 in_stack_ffffffffffffe5a0;
  undefined4 uVar26;
  undefined4 in_stack_ffffffffffffe5a4;
  undefined4 uVar27;
  undefined4 in_stack_ffffffffffffe5a8;
  undefined4 in_stack_ffffffffffffe5ac;
  undefined4 uVar28;
  undefined4 in_stack_ffffffffffffe5b0;
  llama_token in_stack_ffffffffffffe5b4;
  undefined4 in_stack_ffffffffffffe5b8;
  llama_pos pos;
  undefined2 in_stack_ffffffffffffe5bc;
  undefined2 uVar29;
  undefined1 in_stack_ffffffffffffe5be;
  undefined1 uVar30;
  undefined1 in_stack_ffffffffffffe5bf;
  undefined1 uVar31;
  undefined4 in_stack_ffffffffffffe5c0;
  undefined4 uVar32;
  undefined4 in_stack_ffffffffffffe5c4;
  int G_00;
  llama_context *in_stack_ffffffffffffe5c8;
  allocator_type *__a;
  ngram_container *in_stack_ffffffffffffe5d0;
  iterator in_stack_ffffffffffffe5d8;
  size_type in_stack_ffffffffffffe5e0;
  undefined8 in_stack_ffffffffffffe5e8;
  llama_context *in_stack_ffffffffffffe5f0;
  common_sampler *in_stack_ffffffffffffe5f8;
  float local_19cc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe638;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe640;
  value_type vVar33;
  pointer in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe690;
  llama_token in_stack_ffffffffffffe694;
  common_params *in_stack_ffffffffffffe7c0;
  undefined4 uStack_1810;
  undefined4 uStack_180c;
  undefined4 uStack_1800;
  llama_token lStack_17fc;
  int local_17d0;
  int local_17cc;
  int local_17c8;
  int local_17c4;
  int local_17c0;
  int local_17bc;
  byte local_17b5;
  int local_17b4;
  int local_17b0;
  byte local_17a9;
  int local_17a8;
  value_type local_17a4;
  int local_17a0;
  vector<int,_std::allocator<int>_> local_1798;
  int local_177c;
  int local_1778;
  int local_1774;
  int local_1770;
  int local_176c;
  string local_1768 [32];
  int local_1748;
  int local_1744;
  int local_1740;
  llama_seq_id local_173c;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  int32_t *local_1718;
  undefined8 uStack_1710;
  allocator_type *local_1708;
  int local_16f4;
  int *local_16f0;
  undefined8 local_16e8;
  int local_16c8;
  int local_16c4;
  int local_16c0;
  int local_16bc;
  int local_16b4;
  int *local_16b0;
  undefined8 local_16a8;
  value_type local_1688;
  int local_1684;
  int local_1680;
  int local_167c;
  int local_1678;
  value_type local_1674;
  string local_1670 [32];
  long local_1650;
  undefined1 local_1648 [40];
  undefined4 in_stack_ffffffffffffe9e0;
  undefined4 in_stack_ffffffffffffe9e4;
  llama_model *in_stack_ffffffffffffe9e8;
  vector<int,_std::allocator<int>_> vStack_1600;
  vector<int,_std::allocator<int>_> local_15e8;
  int local_15d0;
  vector<int,_std::allocator<int>_> local_15c8;
  vector<int,_std::allocator<int>_> local_15b0;
  int local_1594;
  int local_1590;
  common_params *in_stack_ffffffffffffea78;
  vector<int,_std::allocator<int>_> local_1568;
  vector<ngram_data,_std::allocator<ngram_data>_> local_1548;
  common_sampler *local_1530;
  llama_batch local_1528;
  byte local_14e9;
  llama_token local_14e8;
  int local_14e4;
  uint local_14e0;
  uint local_14dc;
  long local_14d8;
  int local_14cc;
  undefined4 local_14c8;
  llama_token lStack_14c4;
  undefined4 uStack_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b4;
  undefined4 uStack_14b0;
  llama_token lStack_14ac;
  llama_pos local_14a8;
  undefined4 uStack_14a4;
  undefined4 uStack_14a0;
  int iStack_149c;
  allocator_type *local_1498;
  undefined1 local_1490 [8];
  undefined4 uStack_1488;
  undefined4 uStack_1484;
  long local_1458;
  uint local_144c;
  string local_1448 [36];
  int local_1424;
  int *local_1420;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1418;
  vector<int,_std::allocator<int>_> *local_1410;
  uint local_1408;
  int local_1404;
  vector<int,_std::allocator<int>_> local_13d0;
  undefined8 local_13b8;
  pointer local_13b0;
  pointer local_13a8;
  byte local_1375;
  int local_1374 [7];
  int local_1358;
  undefined4 local_1354;
  undefined4 local_ca8;
  _func_void_int_char_ptr_ptr *in_stack_fffffffffffff930;
  llama_example in_stack_fffffffffffff93c;
  common_params *in_stack_fffffffffffff940;
  char **in_stack_fffffffffffff948;
  int in_stack_fffffffffffff950;
  byte local_32a;
  int local_4;
  
  common_params::common_params(in_stack_ffffffffffffe7c0);
  bVar9 = common_params_parse(in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                              in_stack_fffffffffffff940,in_stack_fffffffffffff93c,
                              in_stack_fffffffffffff930);
  if (!bVar9) {
    local_4 = 1;
    local_1374[3] = 1;
    goto LAB_00179504;
  }
  common_init();
  local_1374[2] = 0xf;
  local_1374[1] = 5;
  local_1374[0] = 0xf;
  local_1375 = local_32a & 1;
  llama_backend_init();
  llama_numa_init(local_ca8);
  common_init_from_params(in_stack_ffffffffffffea78);
  local_13a8 = std::unique_ptr<llama_model,_llama_model_deleter>::get
                         ((unique_ptr<llama_model,_llama_model_deleter> *)
                          CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  local_13b0 = std::unique_ptr<llama_context,_llama_context_deleter>::get
                         ((unique_ptr<llama_context,_llama_context_deleter> *)
                          CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  local_13b8 = llama_model_get_vocab(local_13a8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x177253);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x177260);
  common_tokenize(in_stack_ffffffffffffe5c8,
                  (string *)CONCAT44(in_stack_ffffffffffffe5c4,in_stack_ffffffffffffe5c0),
                  (bool)in_stack_ffffffffffffe5bf,(bool)in_stack_ffffffffffffe5be);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
  local_1404 = llama_n_ctx(local_13b0);
  local_1408 = local_1404 - 4;
  sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_13d0);
  if ((int)sVar12 <= (int)local_1408) {
    if (-1 < common_log_verbosity_thold) {
      pcVar13 = common_log_main();
      common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"\n\n");
    }
    local_1410 = &local_13d0;
    local_1418._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffe59c,in_stack_ffffffffffffe598));
    local_1420 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffe59c,in_stack_ffffffffffffe598));
    while (bVar9 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffe59c,in_stack_ffffffffffffe598)), bVar9)
    {
      piVar14 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_1418);
      local_1424 = *piVar14;
      if (-1 < common_log_verbosity_thold) {
        pcVar13 = common_log_main();
        common_token_to_piece_abi_cxx11_
                  ((llama_context *)
                   CONCAT17(in_stack_ffffffffffffe5bf,
                            CONCAT16(in_stack_ffffffffffffe5be,
                                     CONCAT24(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8)))
                   ,in_stack_ffffffffffffe5b4,SUB41((uint)in_stack_ffffffffffffe5b0 >> 0x18,0));
        uVar18 = std::__cxx11::string::c_str();
        common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"%s",uVar18);
        std::__cxx11::string::~string(local_1448);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1418);
    }
    fflush(_stderr);
    sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_13d0);
    local_144c = (uint)sVar12;
    local_1458 = ggml_time_us();
    plVar8 = local_13b0;
    piVar15 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x177596);
    llama_batch_get_one(local_1490,piVar15,local_144c - 1);
    llama_decode(plVar8);
    plVar8 = local_13b0;
    pvVar16 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)CONCAT44(uStack_1484,uStack_1488));
    llama_batch_get_one(&local_14c8,pvVar16,1);
    uVar29 = (undefined2)uStack_14a4;
    uVar30 = (undefined1)((uint)uStack_14a4 >> 0x10);
    uVar31 = (undefined1)((uint)uStack_14a4 >> 0x18);
    llama_decode(plVar8);
    uVar23 = local_14c8;
    lVar25 = lStack_14c4;
    uVar26 = uStack_14c0;
    uVar27 = uStack_14bc;
    uVar28 = uStack_14b4;
    uStack_1800 = uStack_14b0;
    lStack_17fc = lStack_14ac;
    pos = local_14a8;
    uVar32 = uStack_14a0;
    G_00 = iStack_149c;
    __a = local_1498;
    for (local_14cc = 1; local_14cc < 0x1f; local_14cc = local_14cc + 1) {
      llama_kv_self_seq_cp(local_13b0,0,local_14cc,0xffffffff);
    }
    local_14d8 = ggml_time_us();
    local_14dc = 0;
    local_14e0 = 0;
    sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_13d0);
    local_14e4 = (int)sVar12;
    local_14e8 = 0;
    local_14e9 = 0;
    llama_batch_init(&local_1528,local_1354,0,0x1f);
    local_1530 = common_sampler_init(in_stack_ffffffffffffe9e8,
                                     (common_params_sampling *)
                                     CONCAT44(in_stack_ffffffffffffe9e4,in_stack_ffffffffffffe9e0));
    std::allocator<ngram_data>::allocator((allocator<ngram_data> *)0x17776f);
    std::vector<ngram_data,_std::allocator<ngram_data>_>::vector
              ((vector<ngram_data,_std::allocator<ngram_data>_> *)CONCAT44(G_00,uVar32),
               CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
               (allocator_type *)CONCAT44(lStack_17fc,uStack_1800));
    std::allocator<ngram_data>::~allocator((allocator<ngram_data> *)0x177798);
    std::allocator<int>::allocator((allocator<int> *)0x1777ad);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
               CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
               (allocator_type *)CONCAT44(lStack_17fc,uStack_1800));
    std::allocator<int>::~allocator((allocator<int> *)0x1777d6);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1777eb);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(G_00,uVar32),CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
             (allocator_type *)CONCAT44(lStack_17fc,uStack_1800));
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x177814);
    for (local_1590 = 0; local_1590 < 4; local_1590 = local_1590 + 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&stack0xffffffffffffea78,(long)local_1590);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
                 CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))));
      for (local_1594 = 0; local_1594 < 0xf; local_1594 = local_1594 + 1) {
        iVar11 = local_1594 + 100;
        pvVar17 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&stack0xffffffffffffea78,(long)local_1590);
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_1594);
        *pvVar16 = iVar11;
      }
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17796c);
    std::allocator<int>::allocator((allocator<int> *)0x177981);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
               CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
               (allocator_type *)CONCAT44(lStack_17fc,uStack_1800));
    std::allocator<int>::~allocator((allocator<int> *)0x1779aa);
    for (local_15d0 = 0; iVar11 = local_15d0, accept_grammar = (undefined1)((uint)uVar23 >> 0x18),
        local_15d0 < 0x1f; local_15d0 = local_15d0 + 1) {
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_15c8,(long)local_15d0);
      *pvVar16 = iVar11;
    }
    llama_vocab_n_tokens(local_13b8);
    ngram_container::ngram_container
              (in_stack_ffffffffffffe5d0,(int)((ulong)__a >> 0x20),(int)__a,G_00);
    llama_kv_cache_view_init(local_1648,local_13b0,0x1f);
    local_1650 = ggml_time_us();
    local_14e8 = common_sampler_sample
                           (in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
                            (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20),
                            SUB81((ulong)in_stack_ffffffffffffe5e8 >> 0x18,0));
    common_sampler_accept((common_sampler *)CONCAT44(uVar27,uVar26),lVar25,(bool)accept_grammar);
    common_token_to_piece_abi_cxx11_
              ((llama_context *)CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),lStack_17fc,
               SUB41((uint)uStack_1800 >> 0x18,0));
    if (-1 < common_log_verbosity_thold) {
      pcVar13 = common_log_main();
      uVar18 = std::__cxx11::string::c_str();
      common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"%s",uVar18);
    }
    fflush(_stdout);
    std::__cxx11::string::~string(local_1670);
    do {
      if ((local_1375 & 1) != 0) {
        llama_kv_cache_view_update(local_13b0,local_1648);
        common_kv_cache_dump_view_seqs
                  ((llama_kv_cache_view *)
                   CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),
                   (int)((ulong)in_stack_ffffffffffffe688 >> 0x20));
      }
      common_batch_clear(&local_1528);
      common_batch_add((llama_batch *)CONCAT44(G_00,uVar32),CONCAT13(uVar31,CONCAT12(uVar30,uVar29))
                       ,pos,(vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800),
                       SUB41((uint)uVar28 >> 0x18,0));
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe9e8,
                           (long)local_14e8);
      local_1674 = *pvVar16;
      std::vector<ngram_data,_std::allocator<ngram_data>_>::resize
                ((vector<ngram_data,_std::allocator<ngram_data>_> *)CONCAT44(G_00,uVar32),
                 CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))));
      for (local_1678 = 0; local_1678 < local_1674; local_1678 = local_1678 + 1) {
        pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                            (&local_1548,(long)local_1678);
        pvVar19->active = true;
        std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                  (&local_1548,(long)local_1678);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
                   CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))));
        std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                  (&local_1548,(long)local_1678);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
                   CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))));
        iVar11 = local_1678 + 0x10;
        pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                            (&local_1548,(long)local_1678);
        pvVar19->seq_id = iVar11;
        pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                            (&local_1548,(long)local_1678);
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar19->i_batch,0);
        lVar25 = local_14e8;
        *pvVar16 = 0;
        pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                            (&local_1548,(long)local_1678);
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar19->tokens,0);
        *pvVar16 = lVar25;
      }
      for (local_167c = 0; local_167c < 4; local_167c = local_167c + 1) {
        for (local_1680 = 0; local_1680 < local_1674; local_1680 = local_1680 + 1) {
          local_1684 = local_14e8 * 0x3c + local_1680 * 4;
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&local_15e8,(long)(local_1684 + local_167c));
          vVar33 = *pvVar16;
          local_1688 = vVar33;
          pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                              (&local_1548,(long)local_1680);
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pvVar19->tokens,(long)(local_167c + 1));
          iVar24 = local_1528.n_tokens;
          *pvVar16 = vVar33;
          pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                              (&local_1548,(long)local_1680);
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pvVar19->i_batch,(long)(local_167c + 1));
          *pvVar16 = iVar24;
          local_16b4 = local_1680 + 0x10;
          local_16b0 = &local_16b4;
          local_16a8 = 1;
          std::allocator<int>::allocator((allocator<int> *)0x177f2d);
          __l._M_len = in_stack_ffffffffffffe5e0;
          __l._M_array = in_stack_ffffffffffffe5d8;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe5d0,__l,__a);
          common_batch_add((llama_batch *)CONCAT44(G_00,uVar32),
                           CONCAT13(uVar31,CONCAT12(uVar30,uVar29)),pos,
                           (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800),
                           SUB41((uint)uVar28 >> 0x18,0));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
          std::allocator<int>::~allocator((allocator<int> *)0x177f99);
        }
      }
      for (local_16bc = 1; local_16bc < 0xf; local_16bc = local_16bc + 1) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
                   CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))));
        for (local_16c0 = 0; local_16c0 < 0xf - local_16bc; local_16c0 = local_16c0 + 1) {
          iVar11 = local_16bc + local_16c0;
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_15b0,(long)local_16c0)
          ;
          *pvVar16 = iVar11 + 1;
        }
        pvVar17 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&stack0xffffffffffffea78,0);
        std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_16bc);
        common_batch_add((llama_batch *)CONCAT44(G_00,uVar32),
                         CONCAT13(uVar31,CONCAT12(uVar30,uVar29)),pos,
                         (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800),
                         SUB41((uint)uVar28 >> 0x18,0));
      }
      for (local_16c4 = 1; local_16c4 < 4; local_16c4 = local_16c4 + 1) {
        for (local_16c8 = 0; local_16c8 < 0xf; local_16c8 = local_16c8 + 1) {
          pvVar17 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&stack0xffffffffffffea78,(long)local_16c4);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_16c8);
          local_16f4 = local_16c8 + 1;
          local_16f0 = &local_16f4;
          local_16e8 = 1;
          std::allocator<int>::allocator((allocator<int> *)0x1781df);
          __l_00._M_len = in_stack_ffffffffffffe5e0;
          __l_00._M_array = in_stack_ffffffffffffe5d8;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe5d0,__l_00,__a);
          common_batch_add((llama_batch *)CONCAT44(G_00,uVar32),
                           CONCAT13(uVar31,CONCAT12(uVar30,uVar29)),pos,
                           (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800),
                           SUB41((uint)uVar28 >> 0x18,0));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
          std::allocator<int>::~allocator((allocator<int> *)0x178256);
        }
      }
      local_1708 = (allocator_type *)local_1528.logits;
      local_1718 = local_1528.n_seq_id;
      piVar4 = local_1718;
      uStack_1710 = local_1528.seq_id;
      pplVar5 = uStack_1710;
      local_1728 = local_1528.embd;
      pfVar2 = local_1728;
      uStack_1720 = local_1528.pos;
      plVar3 = uStack_1720;
      uStack_1730 = local_1528.token;
      plVar1 = uStack_1730;
      uStack_1730._0_4_ = SUB84(local_1528.token,0);
      uStack_1730._4_4_ = (undefined4)((ulong)local_1528.token >> 0x20);
      local_1728._0_4_ = SUB84(local_1528.embd,0);
      local_1728._4_4_ = (undefined4)((ulong)local_1528.embd >> 0x20);
      uStack_1720._0_4_ = SUB84(local_1528.pos,0);
      uStack_1720._4_4_ = (llama_token)((ulong)local_1528.pos >> 0x20);
      local_1718._0_4_ = (llama_pos)local_1528.n_seq_id;
      uStack_1710._0_4_ = SUB84(local_1528.seq_id,0);
      uStack_1710._4_4_ = (int)((ulong)local_1528.seq_id >> 0x20);
      uVar29 = (undefined2)((ulong)local_1528.n_seq_id >> 0x20);
      uVar30 = (undefined1)((ulong)local_1528.n_seq_id >> 0x30);
      uVar31 = (undefined1)((ulong)local_1528.n_seq_id >> 0x38);
      iVar24 = local_1528.n_tokens;
      lVar25 = local_1528._4_4_;
      uStack_1810 = (undefined4)uStack_1730;
      uStack_180c = uStack_1730._4_4_;
      uVar23 = (undefined4)local_1728;
      uVar28 = local_1728._4_4_;
      uStack_1800 = (undefined4)uStack_1720;
      lStack_17fc = uStack_1720._4_4_;
      pos = (llama_pos)local_1718;
      uVar32 = (undefined4)uStack_1710;
      G_00 = uStack_1710._4_4_;
      __a = (allocator_type *)local_1528.logits;
      uStack_1730 = plVar1;
      local_1728 = pfVar2;
      uStack_1720 = plVar3;
      local_1718 = piVar4;
      uStack_1710 = pplVar5;
      iVar11 = llama_decode(local_13b0);
      if (iVar11 != 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_ERROR,
                         "\n\n%s: llama_decode failed - increase KV cache size\n","main");
        }
        local_4 = 1;
        goto LAB_00179412;
      }
      local_173c = 0;
      for (local_1740 = 0; local_1740 < 5; local_1740 = local_1740 + 1) {
        local_1744 = 0;
        if (0 < local_1740) {
          for (local_1748 = 0; iVar11 = local_1748,
              sVar12 = std::vector<ngram_data,_std::allocator<ngram_data>_>::size(&local_1548),
              iVar11 < (int)sVar12; local_1748 = local_1748 + 1) {
            pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                (&local_1548,(long)local_1748);
            if ((pvVar19->active & 1U) != 0) {
              pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                  (&local_1548,(long)local_1748);
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&pvVar19->i_batch,(long)local_1740);
              local_1744 = *pvVar16;
              pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                  (&local_1548,(long)local_1748);
              local_173c = pvVar19->seq_id;
              local_14e0 = local_14e0 + 1;
              break;
            }
          }
          if (local_1744 == 0) break;
        }
        local_14e8 = common_sampler_sample
                               (in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
                                (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20),
                                SUB81((ulong)in_stack_ffffffffffffe5e8 >> 0x18,0));
        common_sampler_accept
                  ((common_sampler *)CONCAT44(uStack_180c,uStack_1810),lVar25,
                   SUB41((uint)iVar24 >> 0x18,0));
        common_token_to_piece_abi_cxx11_
                  ((llama_context *)CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
                   lStack_17fc,SUB41((uint)uStack_1800 >> 0x18,0));
        if (local_1740 == 0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar13 = common_log_main();
            uVar18 = std::__cxx11::string::c_str();
            common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"%s",uVar18);
          }
        }
        else if (-1 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          uVar18 = std::__cxx11::string::c_str();
          common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"\x1b[0;96m%s\x1b[0m",uVar18);
        }
        fflush(_stdout);
        bVar10 = llama_vocab_is_eog(local_13b8,local_14e8);
        if ((bVar10 & 1) != 0) {
          local_14e9 = 1;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800),
                   (value_type_conflict *)CONCAT44(uVar28,uVar23));
        std::__cxx11::string::~string(local_1768);
        local_14dc = local_14dc + 1;
        local_14e4 = local_14e4 + 1;
        if (((-1 < local_1358) && (local_1358 < (int)local_14dc)) || ((local_14e9 & 1) != 0)) break;
        for (local_176c = 0; iVar11 = local_176c,
            sVar12 = std::vector<ngram_data,_std::allocator<ngram_data>_>::size(&local_1548),
            iVar11 < (int)sVar12; local_176c = local_176c + 1) {
          pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                              (&local_1548,(long)local_176c);
          lVar6 = local_14e8;
          if ((pvVar19->active & 1U) != 0) {
            if (local_1740 == 4) {
              pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                  (&local_1548,(long)local_176c);
              pvVar19->active = false;
            }
            else {
              pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                  (&local_1548,(long)local_176c);
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&pvVar19->tokens,(long)(local_1740 + 1));
              if (lVar6 != *pvVar16) {
                pvVar19 = std::vector<ngram_data,_std::allocator<ngram_data>_>::operator[]
                                    (&local_1548,(long)local_176c);
                pvVar19->active = false;
              }
            }
          }
        }
        for (local_1770 = 0; local_1770 < 0xf; local_1770 = local_1770 + 1) {
          pvVar17 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&stack0xffffffffffffea78,0);
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_1770);
          vVar33 = *pvVar16;
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_1568,(long)local_1770)
          ;
          *pvVar16 = vVar33;
        }
        for (local_1774 = 0; local_1774 < 3; local_1774 = local_1774 + 1) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&stack0xffffffffffffea78,(long)(local_1774 + 1));
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&stack0xffffffffffffea78,(long)local_1774);
          std::vector<int,_std::allocator<int>_>::operator=
                    (in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
        }
        if (local_1740 == 0) {
          for (local_1778 = 0; local_1778 < 0xf; local_1778 = local_1778 + 1) {
            in_stack_ffffffffffffe688 = local_13b0;
            std::vector<ngram_data,_std::allocator<ngram_data>_>::size(&local_1548);
            in_stack_ffffffffffffe694 =
                 common_sampler_sample
                           (in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
                            (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20),
                            SUB81((ulong)in_stack_ffffffffffffe5e8 >> 0x18,0));
            pvVar17 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&stack0xffffffffffffea78,3);
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_1778);
            *pvVar16 = in_stack_ffffffffffffe694;
          }
        }
        else {
          for (local_177c = 0; local_177c < 0xf; local_177c = local_177c + 1) {
            pvVar17 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&stack0xffffffffffffea78,0);
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_177c);
            vVar33 = *pvVar16;
            pvVar17 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&stack0xffffffffffffea78,3);
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_177c);
            *pvVar16 = vVar33;
          }
        }
        if (local_1740 == 0) {
          std::allocator<int>::allocator((allocator<int> *)0x178a21);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(G_00,uVar32),
                     CONCAT17(uVar31,CONCAT16(uVar30,CONCAT24(uVar29,pos))),
                     (allocator_type *)CONCAT44(lStack_17fc,uStack_1800));
          std::allocator<int>::~allocator((allocator<int> *)0x178a4a);
          for (local_17a0 = 0; local_17a0 < 0xf; local_17a0 = local_17a0 + 1) {
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_1568,(long)local_17a0);
            local_17a4 = *pvVar16;
            for (local_17a8 = 0; local_17a8 < 4; local_17a8 = local_17a8 + 1) {
              pvVar17 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)&stack0xffffffffffffea78,(long)local_17a8);
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)local_17a0)
              ;
              vVar33 = *pvVar16;
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_1798,(long)local_17a8);
              *pvVar16 = vVar33;
            }
            local_17a9 = 1;
            for (local_17b0 = 0; iVar11 = local_17b0,
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe9e8,
                                     (long)local_17a4), iVar11 < *pvVar16;
                local_17b0 = local_17b0 + 1) {
              local_17b4 = local_17a4 * 0x3c + local_17b0 * 4;
              local_17b5 = 1;
              for (local_17bc = 0; local_17bc < 4; local_17bc = local_17bc + 1) {
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_15e8,(long)(local_17b4 + local_17bc));
                vVar33 = *pvVar16;
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_1798,(long)local_17bc);
                if (vVar33 != *pvVar16) {
                  local_17b5 = 0;
                  break;
                }
              }
              if ((local_17b5 & 1) != 0) {
                local_17a9 = 0;
                break;
              }
            }
            if ((local_17a9 & 1) != 0) {
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&vStack_1600,(long)local_17a4);
              local_17c0 = *pvVar16;
              local_17c4 = local_17a4 * 0x3c + local_17c0 * 4;
              for (local_17c8 = 0; local_17c8 < 4; local_17c8 = local_17c8 + 1) {
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_1798,(long)local_17c8);
                vVar33 = *pvVar16;
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_15e8,(long)(local_17c4 + local_17c8));
                *pvVar16 = vVar33;
              }
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe9e8,
                                   (long)local_17a4);
              local_17cc = *pvVar16 + 1;
              piVar15 = std::min<int>(local_1374,&local_17cc);
              iVar11 = *piVar15;
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe9e8,
                                   (long)local_17a4);
              *pvVar16 = iVar11;
              iVar11 = local_17c0 + 1;
              pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&vStack_1600,(long)local_17a4);
              *pvVar16 = iVar11 % 0xf;
            }
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
        }
      }
      if (((-1 < local_1358) && (local_1358 < (int)local_14dc)) || ((local_14e9 & 1) != 0))
      goto LAB_00178f1c;
      llama_kv_self_seq_rm(local_13b0,0xffffffff,local_14e4);
      if (local_173c != 0) {
        llama_kv_self_seq_keep(local_13b0,local_173c);
        llama_kv_self_seq_cp(local_13b0,local_173c,0,0xffffffff);
        llama_kv_self_seq_rm(local_13b0,local_173c,0xffffffff);
        for (local_17d0 = 1; local_17d0 < 0x1f; local_17d0 = local_17d0 + 1) {
          llama_kv_self_seq_cp(local_13b0,0,local_17d0,0xffffffff);
        }
      }
    } while( true );
  }
  uStack_1810 = in_stack_ffffffffffffe5a0;
  uStack_180c = in_stack_ffffffffffffe5a4;
  uStack_1800 = in_stack_ffffffffffffe5b0;
  lStack_17fc = in_stack_ffffffffffffe5b4;
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_13d0);
    common_log_add(pcVar13,GGML_LOG_LEVEL_ERROR,"%s: prompt too long (%d tokens, max %d)\n","main",
                   sVar12 & 0xffffffff,(ulong)local_1408);
    uStack_1810 = in_stack_ffffffffffffe5a0;
    uStack_180c = in_stack_ffffffffffffe5a4;
    uStack_1800 = in_stack_ffffffffffffe5b0;
    lStack_17fc = in_stack_ffffffffffffe5b4;
  }
  local_4 = 1;
  local_1374[3] = 1;
  goto LAB_001794b2;
LAB_00178f1c:
  lVar20 = ggml_time_us();
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"\n\n");
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    uVar7 = local_144c;
    lVar21 = local_14d8 - local_1458;
    sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_13d0);
    local_19cc = (float)sVar12;
    common_log_add(SUB84((double)((float)lVar21 / 1e+06),0),
                   SUB84((double)(local_19cc / ((float)(local_14d8 - local_1458) / 1e+06)),0),
                   (char *)pcVar13,2,"encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                   (ulong)uVar7);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    fVar22 = (float)(lVar20 - local_1650) / 1e+06;
    common_log_add(SUB84((double)fVar22,0),SUB84((double)((float)(int)local_14dc / fVar22),0),
                   (char *)pcVar13,2,"decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n");
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"\n");
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"W = %2d\n",0xf);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"N = %2d\n",5);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"G = %2d\n",0xf);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"\n");
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"n_predict = %d\n",(ulong)local_14dc);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"n_accept  = %d\n",(ulong)local_14e0);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_INFO,"\n");
  }
  common_perf_print((llama_context *)CONCAT44(uStack_180c,uStack_1810),
                    (common_sampler *)CONCAT44(lVar25,iVar24));
  common_sampler_free((common_sampler *)CONCAT44(uStack_180c,uStack_1810));
  llama_kv_cache_view_free(local_1648);
  uStack_1810 = SUB84(local_1528.token,0);
  uStack_180c = (undefined4)((ulong)local_1528.token >> 0x20);
  uStack_1800 = SUB84(local_1528.pos,0);
  lStack_17fc = (llama_token)((ulong)local_1528.pos >> 0x20);
  llama_batch_free();
  llama_backend_free();
  if (-1 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_NONE,"\n\n");
  }
  local_4 = 0;
LAB_00179412:
  local_1374[3] = 1;
  ngram_container::~ngram_container((ngram_container *)CONCAT44(uStack_180c,uStack_1810));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)CONCAT44(lStack_17fc,uStack_1800));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
  std::vector<ngram_data,_std::allocator<ngram_data>_>::~vector
            ((vector<ngram_data,_std::allocator<ngram_data>_> *)CONCAT44(lStack_17fc,uStack_1800));
LAB_001794b2:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_17fc,uStack_1800));
  common_init_result::~common_init_result((common_init_result *)CONCAT44(uStack_180c,uStack_1810));
  in_stack_ffffffffffffe5a0 = uStack_1810;
  in_stack_ffffffffffffe5a4 = uStack_180c;
LAB_00179504:
  common_params::~common_params
            ((common_params *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_COMMON)) {
        return 1;
    }

    common_init();

    const int W = 15; // lookahead window
    const int N = 5;  // n-gram size
    const int G = 15; // max verification n-grams

    const bool dump_kv_cache = params.dump_kv_cache;

    // init llama.cpp
    llama_backend_init();
    llama_numa_init(params.numa);

    // load the target model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // Tokenize the prompt
    std::vector<llama_token> inp;
    std::vector<llama_token> all;

    inp = common_tokenize(ctx, params.prompt, true, true);
    all = inp;

    const int max_context_size     = llama_n_ctx(ctx);
    const int max_tokens_list_size = max_context_size - 4;

    if ((int) inp.size() > max_tokens_list_size) {
        LOG_ERR("%s: prompt too long (%d tokens, max %d)\n", __func__, (int) inp.size(), max_tokens_list_size);
        return 1;
    }

    LOG("\n\n");

    for (auto id : inp) {
        LOG("%s", common_token_to_piece(ctx, id).c_str());
    }

    fflush(stderr);

    const int n_input = inp.size();

    const auto t_enc_start = ggml_time_us();

    // eval the prompt
    llama_decode(ctx, llama_batch_get_one( inp.data(), n_input - 1));
    llama_decode(ctx, llama_batch_get_one(&inp.back(),           1));

    for (int s = 1; s < W + G + 1; ++s) {
        llama_kv_self_seq_cp(ctx, 0, s, -1, -1);
    }

    const auto t_enc_end = ggml_time_us();

    int n_predict = 0;
    int n_accept  = 0;

    int n_past = inp.size();

    llama_token id = 0;

    // used to determine end of generation
    bool has_eos = false;

    // for each decoded batch, we have at most W + G + 1 distinct sequences:
    // seq_id == 0           : the current input token
    // seq_id [1, W]         : tokens from the past N - 1 Jacobi iterations
    // seq_id [W + 1, W + G] : verification n-grams
    llama_batch batch = llama_batch_init(params.n_ctx, 0, W + G + 1);

    // target model sampling context
    struct common_sampler * smpl = common_sampler_init(model, params.sampling);

    // verification n-grams
    std::vector<ngram_data> ngrams_cur(G);

    // tokens for the past N - 1 Jacobi iterations
    std::vector<llama_token> tokens_j_prev(W);
    std::vector<std::vector<llama_token>> tokens_j(N - 1);
    for (int j = 0; j < N - 1; j++) {
        tokens_j[j].resize(W);

        for (int i = 0; i < W; i++) {
            // there are different ways to init these tokens
            if (0) {
                // initialize randomly from the prompt tokens
                tokens_j[j][i] = all[1 + rand() % (all.size() - 1)];
            } else {
                // initialize with a sequence of increasing numbers
                tokens_j[j][i] = 100 + i;
            }
        }
    }

    std::vector<llama_seq_id> seq_id_look;

    // the input token belongs both to all sequences
    std::vector<llama_seq_id> seq_id_all(W + G + 1);
    for (int i = 0; i < W + G + 1; i++) {
        seq_id_all[i] = i;
    }

    // here we keep adding new n-grams as we go
    ngram_container ngrams_observed(llama_vocab_n_tokens(vocab), N, G);

    // debug
    struct llama_kv_cache_view kvc_view = llama_kv_cache_view_init(ctx, W + G + 1);

    const auto t_dec_start = ggml_time_us();

    // sample first token
    {
        id = common_sampler_sample(smpl, ctx, 0);

        common_sampler_accept(smpl, id, true);

        {
            const std::string token_str = common_token_to_piece(ctx, id);

            LOG("%s", token_str.c_str());
            fflush(stdout);
        }
    }

    while (true) {
        // debug
        if (dump_kv_cache) {
            llama_kv_cache_view_update(ctx, &kvc_view);
            common_kv_cache_dump_view_seqs(kvc_view, 40);
        }

        // build the mask from https://lmsys.org/blog/2023-11-21-lookahead-decoding/
        //
        // Example for W = 5, N = 4, G = 2:
        // (I = input, L = lookahead, V = verification)
        //
        // Batch:  0  1  2  3  4  5  6  7  8  9 10 11 12 13 14 15 16 17 18 19 20
        // T:        -2 -2 -2 -2 -1 -1 -1 -1 -1  0  0  0  0  0  0
        // Info:   I  L  L  L  L  L  L  L  L  L  L  L  L  L  L  V  V  V  V  V  V
        // Pos:    0  1  2  3  4  1  2  3  4  5  2  3  4  5  6  1  2  3  1  2  3   (+ n_past)
        // Logits: 1  0  0  0  0  0  0  0  0  0  1  1  1  1  1  1  1  1  1  1  1
        // ---------------------------------------------------------------------
        // Seq:    0
        //         1              1              1
        //         2  2              2              2
        //         3  3  3              3              3
        //         4  4  4  4              4              4
        //         5  5  5  5  5              5              5
        //         6                                            6  6  6
        //         7                                                     7  7  7
        // ---------------------------------------------------------------------
        //                                       |  |  |  |  |  |  |  |  |  |  |
        //                                       V  V  V  V  V  |  |  |  |  |  |
        //                                         j_tokens     |  |  |  |  |  |
        //                                                      V  V  V  V  V  V
        //                                                             id
        {
            common_batch_clear(batch);

            // current token - first token of the first level
            common_batch_add(batch, id, n_past, seq_id_all, true);

            // verification n-grams - queue this before the lookahead tokens for less KV cache fragmentation
            {
                const int g_cur = ngrams_observed.cnt[id];

                ngrams_cur.resize(g_cur);
                for (int g = 0; g < g_cur; g++) {
                    ngrams_cur[g].active = true;
                    ngrams_cur[g].tokens.resize(N);
                    ngrams_cur[g].i_batch.resize(N);
                    ngrams_cur[g].seq_id = W + 1 + g;
                    ngrams_cur[g].i_batch[0] = 0;
                    ngrams_cur[g].tokens [0] = id;
                }

                for (int j = 0; j < N - 1; j++) {
                    for (int g = 0; g < g_cur; g++) {
                        const int idx = id*(N - 1)*G + g*(N - 1);

                        const llama_token t = ngrams_observed.tokens[idx + j];

                        ngrams_cur[g].tokens [j + 1] = t;
                        ngrams_cur[g].i_batch[j + 1] = batch.n_tokens;

                        common_batch_add(batch, t, n_past + j + 1, { W + 1 + g }, true);
                    }
                }
            }

            // fill the remaining W - 1 tokens for the first level
            for (int i = 1; i < W; i++) {
                seq_id_look.resize(W - i);
                for (int j = 0; j < W - i; j++) {
                    seq_id_look[j] = i + j + 1;
                }

                common_batch_add(batch, tokens_j[0][i], n_past + i, seq_id_look, false);
            }

            // fill the rest of the levels
            for (int j = 1; j < N - 1; j++) {
                for (int i = 0; i < W; i++) {
                    common_batch_add(batch, tokens_j[j][i], n_past + j + i, { i + 1 }, j == N - 2);
                }
            }
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("\n\n%s: llama_decode failed - increase KV cache size\n", __func__);
            return 1;
        }

        int seq_id_best = 0;

        for (int v = 0; v < N; ++v) {
            int i_batch = 0;

            // if no active ngrams are left, it means the sampled token does not pass the verification
            if (v > 0) {
                for (int g = 0; g < (int) ngrams_cur.size(); g++) {
                    if (ngrams_cur[g].active) {
                        i_batch = ngrams_cur[g].i_batch[v];
                        seq_id_best = ngrams_cur[g].seq_id;

                        ++n_accept;
                        break;
                    }
                }

                // no more matches -> create a new batch
                if (i_batch == 0) {
                    break;
                }
            }

            // sample the next token
            id = common_sampler_sample(smpl, ctx, i_batch);

            common_sampler_accept(smpl, id, true);

            // print
            {
                const std::string token_str = common_token_to_piece(ctx, id);

                if (v == 0) {
                    LOG("%s", token_str.c_str());
                } else {
                    // print light cyan
                    LOG("\033[0;96m%s\033[0m", token_str.c_str());
                }
                fflush(stdout);

                if (llama_vocab_is_eog(vocab, id)) {
                    has_eos = true;
                }

                all.push_back(id);
            }

            ++n_predict;
            ++n_past;

            if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
                break;
            }

            // verify across active n-grams
            for (int g = 0; g < (int) ngrams_cur.size(); g++) {
                if (ngrams_cur[g].active) {
                    if (v == N - 1) {
                        ngrams_cur[g].active = false;
                    } else {
                        if (id != ngrams_cur[g].tokens[v + 1]) {
                            ngrams_cur[g].active = false;
                        }
                    }
                }
            }

            // print known n-grams starting with token id (debug)
            if (0 && v == 0) {
                if (ngrams_observed.cnt[id] > 0) {
                    LOG("\n - %d n-grams starting with '%s'\n", ngrams_observed.cnt[id], common_token_to_piece(ctx, id).c_str());
                }

                for (int i = 0; i < ngrams_observed.cnt[id]; i++) {
                    LOG("   - ngram %2d: ", i);

                    const int idx = id*(N - 1)*G + i*(N - 1);

                    for (int j = 0; j < N - 1; j++) {
                        const std::string token_str = common_token_to_piece(ctx, ngrams_observed.tokens[idx + j]);

                        LOG("%s", token_str.c_str());
                    }

                    LOG("\n");
                }
            }

            // update lookahead tokens
            {
                for (int i = 0; i < W; i++) {
                    tokens_j_prev[i] = tokens_j[0][i];
                }

                for (int j = 0; j < N - 2; j++) {
                    tokens_j[j] = tokens_j[j + 1];
                }

                if (v == 0) {
                    // sample from the last level
                    for (int i = 0; i < W; i++) {
                        tokens_j[N - 2][i] = common_sampler_sample(smpl, ctx, ngrams_cur.size()*(N-1) + W*(N - 2) + i);
                    }
                } else {
                    for (int i = 0; i < W; i++) {
                        // there are different ways to init these tokens
                        if (0) {
                            // random init
                            tokens_j[N - 2][i] = all[1 + rand() % (all.size() - 1)];
                        } else {
                            // init from the previous level
                            tokens_j[N - 2][i] = tokens_j[0][i];
                        }
                    }
                }
            }

            // update observed ngrams
            if (v == 0) {
                // the first token of the n-gram is determined by the index in the container so it is not stored
                std::vector<llama_token> ngram(N - 1);

                // n-gram generation
                // ref: https://github.com/hao-ai-lab/LookaheadDecoding/issues/14#issuecomment-1826198518
                for (int f = 0; f < W; ++f) {
                    const int ft = tokens_j_prev[f]; // first token of the n-gram

                    for (int j = 0; j < N - 1; ++j) {
                        ngram[j] = tokens_j[j][f];
                    }

                    // filter-out repeating n-grams
                    {
                        bool is_unique = true;

                        for (int k = 0; k < ngrams_observed.cnt[ft]; ++k) {
                            const int idx = ft*(N - 1)*G + k*(N - 1);

                            bool is_match = true;
                            for (int j = 0; j < N - 1; ++j) {
                                if (ngrams_observed.tokens[idx + j] != ngram[j]) {
                                    is_match = false;
                                    break;
                                }
                            }

                            if (is_match) {
                                is_unique = false;
                                break;
                            }
                        }

                        if (!is_unique) {
                            continue;
                        }
                    }

                    const int head = ngrams_observed.head[ft];
                    const int idx  = ft*(N - 1)*G + head*(N - 1);

                    for (int i = 0; i < N - 1; i++) {
                        ngrams_observed.tokens[idx + i] = ngram[i];
                    }

                    ngrams_observed.cnt[ft]  = std::min(G, ngrams_observed.cnt[ft] + 1);
                    ngrams_observed.head[ft] = (head + 1) % G;

                    ngrams_observed.n_total++;
                }
            }
        }

        if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
            break;
        }

        // KV cache management
        // if no verification token matched, we simply remove all cells from this batch -> no fragmentation
        llama_kv_self_seq_rm(ctx, -1, n_past, -1);

        if (seq_id_best != 0) {
            // if a verification token matched, we keep the best sequence and remove the rest
            // this leads to some KV cache fragmentation
            llama_kv_self_seq_keep(ctx, seq_id_best);
            llama_kv_self_seq_cp  (ctx, seq_id_best, 0, -1, -1);
            llama_kv_self_seq_rm  (ctx, seq_id_best,    -1, -1);

            for (int s = 1; s < W + G + 1; ++s) {
                llama_kv_self_seq_cp(ctx, 0, s, -1, -1);
            }
        }
    }

    auto t_dec_end = ggml_time_us();

    LOG("\n\n");

    LOG_INF("encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_input,   (t_enc_end - t_enc_start) / 1e6f, inp.size() / ((t_enc_end - t_enc_start) / 1e6f));
    LOG_INF("decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_predict, (t_dec_end - t_dec_start) / 1e6f, n_predict  / ((t_dec_end - t_dec_start) / 1e6f));

    LOG_INF("\n");
    LOG_INF("W = %2d\n", W);
    LOG_INF("N = %2d\n", N);
    LOG_INF("G = %2d\n", G);
    LOG_INF("\n");
    LOG_INF("n_predict = %d\n", n_predict);
    LOG_INF("n_accept  = %d\n", n_accept);

    LOG_INF("\n");
    common_perf_print(ctx, smpl);

    common_sampler_free(smpl);

    llama_kv_cache_view_free(&kvc_view);

    llama_batch_free(batch);

    llama_backend_free();

    LOG("\n\n");

    return 0;
}